

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseNmtoken(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  uint uVar10;
  int l;
  xmlChar buf [105];
  int local_b0;
  int local_ac;
  xmlChar local_a8 [120];
  
  iVar7 = 10000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    iVar7 = 50000;
  }
  iVar3 = xmlCurrentChar(ctxt,&local_b0);
  uVar6 = 0;
  do {
    iVar4 = xmlIsNameChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar3);
    if (iVar4 == 0) {
      if (uVar6 == 0) goto LAB_001312fc;
      pxVar8 = xmlStrndup(local_a8,uVar6);
      if (pxVar8 != (xmlChar *)0x0) {
        return pxVar8;
      }
      goto LAB_001312ba;
    }
    if (iVar3 < 0x80) {
      uVar10 = uVar6 + 1;
      local_a8[(int)uVar6] = (xmlChar)iVar3;
    }
    else {
      iVar3 = xmlCopyCharMultiByte(local_a8 + (int)uVar6,iVar3);
      uVar10 = uVar6 + iVar3;
    }
    pxVar1 = ctxt->input;
    if (*pxVar1->cur == '\n') {
      pxVar1->line = pxVar1->line + 1;
      pxVar1->col = 1;
    }
    else {
      pxVar1->col = pxVar1->col + 1;
    }
    pxVar1->cur = pxVar1->cur + local_b0;
    iVar3 = xmlCurrentChar(ctxt,&local_b0);
    uVar6 = uVar10;
  } while ((int)uVar10 < 100);
  iVar4 = uVar10 * 2;
  pxVar8 = (xmlChar *)(*xmlMalloc)((size_t)iVar4);
  if (pxVar8 == (xmlChar *)0x0) {
LAB_001312ba:
    xmlCtxtErrMemory(ctxt);
LAB_001312fc:
    pxVar8 = (xmlChar *)0x0;
  }
  else {
    memcpy(pxVar8,local_a8,(ulong)uVar10);
    iVar5 = xmlIsNameChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar3);
    local_ac = iVar7;
    while (iVar5 != 0) {
      pxVar9 = pxVar8;
      if (iVar4 < (int)(uVar10 + 10)) {
        if (iVar4 < 1) {
          iVar4 = 1;
LAB_00131212:
          pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,(size_t)iVar4);
          if (pxVar9 != (xmlChar *)0x0) goto LAB_0013122d;
          xmlCtxtErrMemory(ctxt);
        }
        else {
          if (iVar4 < local_ac) {
            uVar6 = iVar4 + 1U >> 1;
            bVar2 = (int)(local_ac - uVar6) < iVar4;
            iVar4 = uVar6 + iVar4;
            if (bVar2) {
              iVar4 = local_ac;
            }
            goto LAB_00131212;
          }
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NmToken");
        }
        (*xmlFree)(pxVar8);
        goto LAB_001312fc;
      }
LAB_0013122d:
      if (iVar3 < 0x80) {
        uVar6 = uVar10 + 1;
        pxVar9[(int)uVar10] = (xmlChar)iVar3;
      }
      else {
        iVar7 = xmlCopyCharMultiByte(pxVar9 + (int)uVar10,iVar3);
        uVar6 = iVar7 + uVar10;
      }
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + local_b0;
      iVar3 = xmlCurrentChar(ctxt,&local_b0);
      iVar5 = xmlIsNameChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar3);
      pxVar8 = pxVar9;
      uVar10 = uVar6;
    }
    pxVar8[(int)uVar10] = '\0';
  }
  return pxVar8;
}

Assistant:

xmlChar *
xmlParseNmtoken(xmlParserCtxtPtr ctxt) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *ret;
    int len = 0, l;
    int c;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

    c = xmlCurrentChar(ctxt, &l);

    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(buf, len, c);
	NEXTL(l);
	c = xmlCurrentChar(ctxt, &l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge token, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		COPY_BUF(buffer, len, c);
		NEXTL(l);
		c = xmlCurrentChar(ctxt, &l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
        return(NULL);
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
        return(NULL);
    }
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlErrMemory(ctxt);
    return(ret);
}